

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

ON_3dVector * __thiscall
ON_SubDMeshFragment::CenterNormal(ON_3dVector *__return_storage_ptr__,ON_SubDMeshFragment *this)

{
  byte bVar1;
  double *pdVar2;
  size_t sVar3;
  double dVar4;
  ON_3dVector N;
  ON_3dVector OStack_28;
  
  pdVar2 = this->m_N;
  if ((((pdVar2 == (double *)0x0) || (sVar3 = this->m_N_stride, sVar3 - 1 < 2)) ||
      (bVar1 = (this->m_grid).m_side_segment_count, bVar1 == 0)) ||
     ((this->m_grid).m_S == (uint *)0x0)) {
    __return_storage_ptr__->z = ON_3dVector::NanVector.z;
    dVar4 = ON_3dVector::NanVector.y;
    __return_storage_ptr__->x = ON_3dVector::NanVector.x;
    __return_storage_ptr__->y = dVar4;
  }
  else if (bVar1 == 1) {
    ON_3dVector::ON_3dVector
              (&OStack_28,*pdVar2 + pdVar2[sVar3] + pdVar2[sVar3 * 2] + pdVar2[sVar3 * 3],
               pdVar2[1] + pdVar2[sVar3 + 1] + pdVar2[sVar3 * 2 + 1] + pdVar2[sVar3 * 3 + 1],
               pdVar2[2] + pdVar2[sVar3 + 2] + pdVar2[sVar3 * 2 + 2] + pdVar2[sVar3 * 3 + 2]);
    ON_3dVector::UnitVector(__return_storage_ptr__,&OStack_28);
  }
  else {
    ON_3dVector::ON_3dVector
              (__return_storage_ptr__,pdVar2 + sVar3 * ((bVar1 + 2) * (uint)bVar1 >> 1));
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_3dVector ON_SubDMeshFragment::CenterNormal() const
{
  if (nullptr == m_N || (m_N_stride != 0 && m_N_stride < 3) || m_grid.m_side_segment_count <= 0 || nullptr == m_grid.m_S)
    return ON_3dVector::NanVector;

  if (1 == m_grid.m_side_segment_count)
  {
    const ON_3dVector N(
      (m_N[0] + m_N[m_N_stride] + m_N[2 * m_N_stride] + m_N[3 * m_N_stride]),
      (m_N[1] + m_N[1 + m_N_stride] + m_N[1 + 2 * m_N_stride] + m_N[1 + 3 * m_N_stride]),
      (m_N[2] + m_N[2 + m_N_stride] + m_N[2 + 2 * m_N_stride] + m_N[2 + 3 * m_N_stride])
    );
    return N.UnitVector();
  }

  const unsigned int i = (m_grid.m_side_segment_count*(m_grid.m_side_segment_count + 2)) / 2;

  return ON_3dVector(m_N + (i*m_N_stride));
}